

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstParamParser.cpp
# Opt level: O0

void __thiscall
SstParamParser::ParseParams(SstParamParser *this,IO *io,_SstParams *Params,UserOptions *userOptions)

{
  long in_RCX;
  undefined8 *in_RDX;
  anon_class_8_1_3fcf65e4 lf_SetSpecPreloadModeParameter;
  anon_class_8_1_3fcf65e4 lf_SetStepDistributionModeParameter;
  anon_class_8_1_3fcf65e4 lf_SetQueueFullPolicyParameter;
  anon_class_8_1_3fcf65e4 lf_SetCPCommPatternParameter;
  anon_class_8_1_3fcf65e4 lf_SetMarshalMethodParameter;
  anon_class_8_1_3fcf65e4 lf_SetIsRowMajorParameter;
  anon_class_8_1_3fcf65e4 lf_SetCompressionMethodParameter;
  anon_class_8_1_3fcf65e4 lf_SetRegMethodParameter;
  anon_class_8_1_3fcf65e4 lf_SetStringParameter;
  anon_class_8_1_3fcf65e4 lf_SetIntParameter;
  anon_class_8_1_3fcf65e4 lf_SetBoolParameter;
  char **in_stack_fffffffffffffa58;
  allocator *parameter;
  string *in_stack_fffffffffffffa60;
  string *key;
  anon_class_8_1_3fcf65e4 *in_stack_fffffffffffffa68;
  allocator *this_00;
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [24];
  size_t *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [16];
  size_t *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  anon_class_8_1_3fcf65e4 *in_stack_fffffffffffffc58;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [55];
  allocator local_99;
  string local_98 [72];
  anon_class_8_1_3fcf65e4 local_50 [7];
  undefined8 *local_18;
  
  in_RDX[0x12] = 0;
  in_RDX[0x13] = 0;
  in_RDX[0x10] = 0;
  in_RDX[0x11] = 0;
  in_RDX[0xe] = 0;
  in_RDX[0xf] = 0;
  in_RDX[0xc] = 0;
  in_RDX[0xd] = 0;
  in_RDX[10] = 0;
  in_RDX[0xb] = 0;
  in_RDX[8] = 0;
  in_RDX[9] = 0;
  in_RDX[6] = 0;
  in_RDX[7] = 0;
  in_RDX[4] = 0;
  in_RDX[5] = 0;
  in_RDX[2] = 0;
  in_RDX[3] = 0;
  *in_RDX = 0;
  in_RDX[1] = 0;
  in_RDX[0x14] = 0;
  *(undefined4 *)(in_RDX + 1) = *(undefined4 *)(in_RCX + 0x70);
  *in_RDX = 2;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"MarshalMethod",&local_99);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
             (size_t *)in_stack_fffffffffffffb98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  *(undefined4 *)(local_18 + 1) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"verbose",&local_d1);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_18[2] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"RegistrationMethod",&local_f9);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_18[3] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"StepDistributionMode",&local_121);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_18[4] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"DataTransport",&local_149);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_18[5] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"WANDataTransport",&local_171);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  *(undefined4 *)(local_18 + 6) = 0x3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"OpenTimeoutSecs",&local_199);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  *(undefined4 *)((long)local_18 + 0x34) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"RendezvousReaderCount",&local_1c1);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  *(undefined4 *)(local_18 + 7) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"QueueLimit",&local_1e9);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  *(undefined4 *)((long)local_18 + 0x3c) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"ReserveQueueLimit",&local_211);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  local_18[8] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"QueueFullPolicy",&local_239);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  *(undefined4 *)(local_18 + 9) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"IsRowMajor",&local_261);
  ParseParams::anon_class_8_1_3fcf65e4::operator()(local_50,&local_260,(int *)(local_18 + 9));
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  *(undefined4 *)((long)local_18 + 0x4c) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"FirstTimestepPrecious",&local_289);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (int *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  local_18[10] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"ControlTransport",&local_2b1);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  local_18[0xb] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"NetworkInterface",&local_2d9);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  local_18[0xc] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"ControlInterface",&local_301);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  local_18[0xd] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"DataInterface",&local_329);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  local_18[0xe] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"CPCommPattern",&local_351);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  local_18[0xf] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"CompressionMethod",&local_379);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  *(undefined4 *)(local_18 + 0x10) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3a0,"AlwaysProvideLatestTimestep",(allocator *)&stack0xfffffffffffffc5f);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (int *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc5f);
  *(undefined4 *)((long)local_18 + 0x84) = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"SpeculativePreloadMode",&local_3c9);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             (int *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  *(undefined4 *)(local_18 + 0x11) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"SpecAutoNodeThreshold",&local_3f1);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,(int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  *(undefined4 *)((long)local_18 + 0x8c) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"ReaderShortCircuitReads",&local_419);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (int *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  *(undefined4 *)(local_18 + 0x12) = 0;
  this_00 = &local_441;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"StatsLevel",this_00);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)this_00,in_stack_fffffffffffffa60,
             (int *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  *(undefined4 *)((long)local_18 + 0x94) = 0;
  key = (string *)&stack0xfffffffffffffb97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffb98,"UseOneTimeAttributes",(allocator *)key);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (int *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb97);
  local_18[0x13] = 0;
  parameter = &local_491;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"RemoteGroup",parameter);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)this_00,key,(char **)parameter);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  local_18[0x14] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"ControlModule",&local_4b9);
  ParseParams::anon_class_8_1_3fcf65e4::operator()
            ((anon_class_8_1_3fcf65e4 *)this_00,key,(char **)parameter);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  return;
}

Assistant:

void SstParamParser::ParseParams(IO &io, struct _SstParams &Params,
                                 const adios2::UserOptions &userOptions)
{
    std::memset(&Params, 0, sizeof(Params));

    auto lf_SetBoolParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string value = itKey->second;
            std::transform(value.begin(), value.end(), value.begin(), ::tolower);
            if (value == "yes" || value == "true" || value == "on")
            {
                parameter = 1;
            }
            else if (value == "no" || value == "false" || value == "off")
            {
                parameter = 0;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst Boolean parameter \"" + value +
                                                         "\"");
            }
        }
    };
    auto lf_SetIntParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = std::stoi(itKey->second);
            return true;
        }
        return false;
    };

    auto lf_SetStringParameter = [&](const std::string key, char *&parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = strdup(itKey->second.c_str());
            return true;
        }
        return false;
    };

    auto lf_SetRegMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "file")
            {
                parameter = SstRegisterFile;
            }
            else if (method == "screen")
            {
                parameter = SstRegisterScreen;
            }
            else if (method == "cloud")
            {
                parameter = SstRegisterCloud;
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Sst RegistrationMethod "
                                                     "\"cloud\" not yet implemented");
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst RegistrationMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCompressionMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "zfp")
            {
                parameter = SstCompressZFP;
            }
            else if (method == "none")
            {
                parameter = SstCompressNone;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CompressionMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    // not really a parameter, but a convenient way to pass this around
    auto lf_SetIsRowMajorParameter = [&](const std::string key, int &parameter) {
        parameter = (io.m_ArrayOrder == adios2::ArrayOrdering::RowMajor);
        return true;
    };

    auto lf_SetMarshalMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "ffs")
            {
                parameter = SstMarshalFFS;
            }
            else if (method == "bp")
            {
                parameter = SstMarshalBP;
            }
            else if (method == "bp5")
            {
                parameter = SstMarshalBP5;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst MarshalMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCPCommPatternParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "min")
            {
                parameter = SstCPCommMin;
            }
            else if (method == "peer")
            {
                parameter = SstCPCommPeer;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CPCommPattern parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetQueueFullPolicyParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "block")
            {
                parameter = SstQueueFullBlock;
            }
            else if (method == "discard")
            {
                parameter = SstQueueFullDiscard;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst QueueFullPolicy parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetStepDistributionModeParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "alltoall")
            {
                parameter = StepsAllToAll;
            }
            else if (method == "roundrobin")
            {
                parameter = StepsRoundRobin;
            }
            else if (method == "ondemand")
            {
                parameter = StepsOnDemand;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst StepDistributionMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };
    auto lf_SetSpecPreloadModeParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "off")
            {
                parameter = SpecPreloadOff;
            }
            else if (method == "on")
            {
                parameter = SpecPreloadOn;
            }
            else if (method == "auto")
            {
                parameter = SpecPreloadAuto;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst SpeculativePreloadMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };

    Params.verbose = userOptions.sst.verbose;

#define get_params(Param, Type, Typedecl, Default)                                                 \
    Params.Param = Default;                                                                        \
    lf_Set##Type##Parameter(#Param, Params.Param);
    SST_FOREACH_PARAMETER_TYPE_4ARGS(get_params);
#undef get_params
}